

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuickprof.cpp
# Opt level: O2

unsigned_long_long __thiscall cbtClock::getTimeNanoseconds(cbtClock *this)

{
  unsigned_long_long uVar1;
  undefined8 in_XMM0_Qa;
  undefined1 auVar2 [16];
  undefined8 in_XMM1_Qa;
  undefined1 auVar3 [16];
  timeval currentTime;
  timeval local_20;
  
  gettimeofday(&local_20,(__timezone_ptr_t)0x0);
  auVar2._0_8_ = (double)(local_20.tv_sec - (this->m_data->mStartTime).tv_sec);
  auVar2._8_8_ = in_XMM0_Qa;
  auVar3._0_8_ = (double)((local_20.tv_usec - (this->m_data->mStartTime).tv_usec) * 1000);
  auVar3._8_8_ = in_XMM1_Qa;
  auVar2 = vfmadd231sd_fma(auVar3,auVar2,ZEXT816(0x41cdcd6500000000));
  uVar1 = vcvttsd2usi_avx512f(auVar2);
  return uVar1;
}

Assistant:

unsigned long long int cbtClock::getTimeNanoseconds()
{
#ifdef BT_USE_WINDOWS_TIMERS
	//see https://msdn.microsoft.com/en-us/library/windows/desktop/dn553408(v=vs.85).aspx
	LARGE_INTEGER currentTime, elapsedTime;

	QueryPerformanceCounter(&currentTime);
	elapsedTime.QuadPart = currentTime.QuadPart -
						   m_data->mStartTime.QuadPart;
	elapsedTime.QuadPart *= 1000000000;
	elapsedTime.QuadPart /= m_data->mClockFrequency.QuadPart;

	return (unsigned long long)elapsedTime.QuadPart;
#else

#ifdef __CELLOS_LV2__
	uint64_t freq = sys_time_get_timebase_frequency();
	double dFreq = ((double)freq) / 1e9;
	typedef uint64_t ClockSize;
	ClockSize newTime;
	//__asm __volatile__( "mftb %0" : "=r" (newTime) : : "memory");
	SYS_TIMEBASE_GET(newTime);

	return (unsigned long int)((double(newTime - m_data->mStartTime)) / dFreq);
#else
#ifdef __APPLE__
	uint64_t ticks = mach_absolute_time() - m_data->mStartTimeNano;
	static long double conversion = 0.0L;
	if (0.0L == conversion)
	{
		// attempt to get conversion to nanoseconds
		mach_timebase_info_data_t info;
		int err = mach_timebase_info(&info);
		if (err)
		{
			cbtAssert(0);
			conversion = 1.;
		}
		conversion = info.numer / info.denom;
	}
	return (ticks * conversion);

#else  //__APPLE__

#ifdef BT_LINUX_REALTIME
	timespec ts;
	clock_gettime(CLOCK_REALTIME, &ts);
	return 1000000000 * ts.tv_sec + ts.tv_nsec;
#else
	struct timeval currentTime;
	gettimeofday(&currentTime, 0);
	return (currentTime.tv_sec - m_data->mStartTime.tv_sec) * 1e9 +
		   (currentTime.tv_usec - m_data->mStartTime.tv_usec) * 1000;
#endif  //BT_LINUX_REALTIME

#endif  //__APPLE__
#endif  //__CELLOS_LV2__
#endif
}